

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RandomBernoulliDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randombernoullidynamic(NeuralNetworkLayer *this)

{
  bool bVar1;
  RandomBernoulliDynamicLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_randombernoullidynamic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_randombernoullidynamic(this);
    this_00 = (RandomBernoulliDynamicLayerParams *)operator_new(0x20);
    RandomBernoulliDynamicLayerParams::RandomBernoulliDynamicLayerParams(this_00);
    (this->layer_).randombernoullidynamic_ = this_00;
  }
  return (RandomBernoulliDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomBernoulliDynamicLayerParams* NeuralNetworkLayer::mutable_randombernoullidynamic() {
  if (!has_randombernoullidynamic()) {
    clear_layer();
    set_has_randombernoullidynamic();
    layer_.randombernoullidynamic_ = new ::CoreML::Specification::RandomBernoulliDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomBernoulliDynamic)
  return layer_.randombernoullidynamic_;
}